

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<unsigned_int,10ul>::swap<9ul>
          (vector_s<unsigned_int,10ul> *this,vector_s<unsigned_int,_9UL> *other)

{
  size_type sVar1;
  size_type sVar2;
  undefined1 local_50 [8];
  vector_s<unsigned_int,_10UL> temp;
  vector_s<unsigned_int,_9UL> *other_local;
  vector_s<unsigned_int,_10UL> *this_local;
  
  temp.data_ptr_ = (pointer)other;
  sVar1 = vector_s<unsigned_int,_9UL>::size(other);
  sVar2 = vector_s<unsigned_int,_10UL>::capacity((vector_s<unsigned_int,_10UL> *)this);
  if (sVar1 <= sVar2) {
    sVar1 = vector_s<unsigned_int,_9UL>::capacity((vector_s<unsigned_int,_9UL> *)temp.data_ptr_);
    sVar2 = vector_s<unsigned_int,_10UL>::size((vector_s<unsigned_int,_10UL> *)this);
    if (sVar2 <= sVar1) {
      vector_s<unsigned_int,_10UL>::vector_s
                ((vector_s<unsigned_int,_10UL> *)local_50,(vector_s<unsigned_int,_10UL> *)this);
      operator=(this,(vector_s<unsigned_int,_9UL> *)temp.data_ptr_);
      vector_s<unsigned_int,9ul>::operator=
                ((vector_s<unsigned_int,9ul> *)temp.data_ptr_,
                 (vector_s<unsigned_int,_10UL> *)local_50);
      vector_s<unsigned_int,_10UL>::~vector_s((vector_s<unsigned_int,_10UL> *)local_50);
    }
  }
  return;
}

Assistant:

void swap(vector_s<T, CAPACITY_OTHER>& other) noexcept
    {
        if ( other.size() > capacity() ||
             other.capacity() < size() ) {
            return;
        }
        vector_s temp(*this);
        *this = other;
        other = temp;
    }